

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  char cVar1;
  ushort uVar2;
  SymbolKind SVar3;
  Scope *pSVar4;
  NameSyntax *className;
  Compilation *pCVar5;
  Type *pTVar6;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this_00;
  bool bVar7;
  SubroutineSymbol *baseSub;
  ClassType *pCVar8;
  Diagnostic *pDVar9;
  iterator iVar10;
  TransparentMemberSymbol *pTVar11;
  Symbol *pSVar12;
  SubroutineSymbol *derivedMethod;
  SubroutineSymbol *pSVar13;
  char *pcVar14;
  MethodPrototypeSymbol *sub;
  iterator iVar15;
  intptr_t iVar16;
  ClassType *pCVar17;
  ClassType *pCVar18;
  SourceRange SVar19;
  iterator __begin2;
  iterator local_58;
  intptr_t local_50;
  Scope *local_48;
  Compilation *local_40;
  _func_void_intptr_t_Symbol_ptr *local_38;
  
  local_38 = insertCB.callback;
  pSVar4 = (context->scope).ptr;
  if (pSVar4 == (Scope *)0x0) {
LAB_003bbe9f:
    pcVar14 = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    className = (extendsClause->baseName).ptr;
    if (className != (NameSyntax *)0x0) {
      pCVar5 = pSVar4->compilation;
      pCVar8 = Lookup::findClass(className,context,(optional<slang::DiagCode>)0x0);
      if (pCVar8 == (ClassType *)0x0) {
LAB_003bbe4c:
        this->baseClass = pCVar5->errorType;
      }
      else {
        pCVar17 = pCVar8;
        local_50 = insertCB.callable;
        if (pCVar8->isInterface != false) {
          this->baseClass = pCVar5->errorType;
          SVar19 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          pDVar9 = ASTContext::addDiag(context,(DiagCode)0x240006,SVar19);
          Diagnostic::operator<<(pDVar9,(pCVar8->super_Type).super_Symbol.name);
          return;
        }
        do {
          if (pCVar17 == this) {
            SVar19 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
            pDVar9 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar19);
            Diagnostic::operator<<(pDVar9,(this->super_Type).super_Symbol.name);
            goto LAB_003bbe4c;
          }
          if ((pCVar17->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pCVar17->super_Scope);
          }
          pTVar6 = pCVar17->baseClass;
          if (pTVar6 == (Type *)0x0) {
LAB_003bb902:
            bVar7 = false;
          }
          else {
            if (pTVar6->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar6);
            }
            if ((pTVar6->canonical->super_Symbol).kind == ErrorType) goto LAB_003bb902;
            pCVar17 = (ClassType *)pTVar6->canonical;
            bVar7 = true;
            if ((pCVar17->super_Type).super_Symbol.kind != ClassType) goto LAB_003bbe69;
          }
          iVar16 = local_50;
        } while (bVar7);
        this->baseClass = &pCVar8->super_Type;
        pSVar4 = &this->super_Scope;
        local_40 = pCVar5;
        if ((this->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(pSVar4);
        }
        this_00 = &((this->super_Scope).nameMap)->
                   super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
        ;
        local_48 = pSVar4;
        if ((pCVar8->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar8->super_Scope);
        }
        local_58.current = (pCVar8->super_Scope).firstMember;
        if ((MethodPrototypeSymbol *)local_58.current != (MethodPrototypeSymbol *)0x0) {
          bVar7 = false;
          do {
            iVar15.current = local_58.current;
            if (((local_58.current)->name)._M_len != 0) {
              SVar3 = ((Symbol *)&(local_58.current)->kind)->kind;
              if (SVar3 == MethodPrototype) {
                if (((ulong)local_58.current[2].originatingSyntax & 8) == 0) goto LAB_003bb9b0;
                pSVar13 = MethodPrototypeSymbol::getSubroutine
                                    ((MethodPrototypeSymbol *)local_58.current);
                this->baseConstructor = &pSVar13->super_Symbol;
              }
              else if ((SVar3 == Subroutine) &&
                      (((ulong)local_58.current[2].originatingSyntax & 0x800000000) != 0)) {
                this->baseConstructor = local_58.current;
              }
              else {
LAB_003bb9b0:
                iVar10 = ska::detailv3::
                         sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                         ::find(this_00,&(local_58.current)->name);
                if (iVar10.current ==
                    this_00->entries + this_00->num_slots_minus_one + (long)this_00->max_lookups) {
                  if (((Symbol *)&(iVar15.current)->kind)->kind == TransparentMember) {
                    iVar15.current = iVar15.current[1];
                  }
                  if ((this->isAbstract == false) &&
                     (((Symbol *)&(iVar15.current)->kind)->kind == MethodPrototype)) {
                    uVar2 = (((MethodPrototypeSymbol *)iVar15.current)->flags).m_bits;
                    if (((uVar2 & 2) != 0) && (!bVar7)) {
                      SVar19 = slang::syntax::SyntaxNode::sourceRange
                                         (&extendsClause->super_SyntaxNode);
                      pDVar9 = ASTContext::addDiag(context,(DiagCode)0x350006,SVar19);
                      Diagnostic::operator<<(pDVar9,(this->super_Type).super_Symbol.name);
                      Diagnostic::operator<<(pDVar9,(pCVar8->super_Type).super_Symbol.name);
                      Diagnostic::operator<<(pDVar9,((Symbol *)&(iVar15.current)->kind)->name);
                      Diagnostic::addNote(pDVar9,(DiagCode)0x40001,
                                          ((Symbol *)&(iVar15.current)->kind)->location);
                      bVar7 = true;
                    }
                    iVar16 = local_50;
                    if ((uVar2 & 2) != 0) goto LAB_003bbb66;
                  }
                  if ((this->isAbstract == false) &&
                     (((Symbol *)&(iVar15.current)->kind)->kind == ConstraintBlock)) {
                    cVar1 = *(char *)((long)&(((MethodPrototypeSymbol *)iVar15.current)->
                                             declaredReturnType).type + 3);
                    if ((cVar1 == '\x01') && (!bVar7)) {
                      SVar19 = slang::syntax::SyntaxNode::sourceRange
                                         (&extendsClause->super_SyntaxNode);
                      pDVar9 = ASTContext::addDiag(context,(DiagCode)0x360006,SVar19);
                      Diagnostic::operator<<(pDVar9,(this->super_Type).super_Symbol.name);
                      Diagnostic::operator<<(pDVar9,(pCVar8->super_Type).super_Symbol.name);
                      Diagnostic::operator<<(pDVar9,((Symbol *)&(iVar15.current)->kind)->name);
                      Diagnostic::addNote(pDVar9,(DiagCode)0x40001,
                                          ((Symbol *)&(iVar15.current)->kind)->location);
                      bVar7 = true;
                    }
                    iVar16 = local_50;
                    if (cVar1 != '\0') goto LAB_003bbb66;
                  }
                  pTVar11 = BumpAllocator::
                            emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                      (&local_40->super_BumpAllocator,iVar15.current);
                  (*local_38)(iVar16,&pTVar11->super_Symbol);
                }
              }
            }
LAB_003bbb66:
            Scope::iterator::operator++(&local_58);
          } while ((MethodPrototypeSymbol *)local_58.current != (MethodPrototypeSymbol *)0x0);
        }
        if ((this->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(local_48);
        }
        local_58.current = (this->super_Scope).firstMember;
        if ((SubroutineSymbol *)local_58.current != (SubroutineSymbol *)0x0) {
          do {
            iVar15.current = local_58.current;
            SVar3 = ((Symbol *)&(local_58.current)->kind)->kind;
            if (SVar3 == Subroutine) {
              pCVar17 = pCVar8;
              if (((ulong)local_58.current[2].originatingSyntax & 0xc00000000) == 0) {
                do {
                  pSVar13 = (SubroutineSymbol *)
                            Scope::find(&pCVar17->super_Scope,(iVar15.current)->name);
                  if (pSVar13 == (SubroutineSymbol *)0x0) {
                    if ((pCVar17->super_Scope).deferredMemberIndex != Invalid) {
                      Scope::elaborate(&pCVar17->super_Scope);
                    }
                    pTVar6 = pCVar17->baseClass;
                    if (pTVar6 == (Type *)0x0) goto LAB_003bbe0d;
                    if (pTVar6->canonical == (Type *)0x0) {
                      Type::resolveCanonical(pTVar6);
                    }
                    pCVar18 = (ClassType *)pTVar6->canonical;
                    SVar3 = (pCVar18->super_Type).super_Symbol.kind;
                    if (SVar3 != ClassType) {
                      if (SVar3 == ErrorType) goto LAB_003bbe0d;
                      goto LAB_003bbe69;
                    }
                    bVar7 = true;
                  }
                  else {
                    if (((pSVar13->super_Symbol).kind == Subroutine) &&
                       ((((pSVar13->flags).m_bits & 1) != 0 ||
                        (pSVar13->overrides != (SubroutineSymbol *)0x0)))) {
                      SubroutineSymbol::setOverride((SubroutineSymbol *)iVar15.current,pSVar13);
                    }
LAB_003bbe0d:
                    bVar7 = false;
                    pCVar18 = pCVar17;
                  }
                  pCVar17 = pCVar18;
                } while (bVar7);
              }
            }
            else if (SVar3 == MethodPrototype) {
              pCVar17 = pCVar8;
              if (((ulong)local_58.current[2].originatingSyntax & 0xc) == 0) {
                do {
                  pSVar12 = Scope::find(&pCVar17->super_Scope,(iVar15.current)->name);
                  if (pSVar12 == (Symbol *)0x0) {
                    if ((pCVar17->super_Scope).deferredMemberIndex != Invalid) {
                      Scope::elaborate(&pCVar17->super_Scope);
                    }
                    pTVar6 = pCVar17->baseClass;
                    if (pTVar6 == (Type *)0x0) goto LAB_003bbd7a;
                    if (pTVar6->canonical == (Type *)0x0) {
                      Type::resolveCanonical(pTVar6);
                    }
                    pCVar18 = (ClassType *)pTVar6->canonical;
                    SVar3 = (pCVar18->super_Type).super_Symbol.kind;
                    if (SVar3 != ClassType) {
                      if (SVar3 == ErrorType) goto LAB_003bbd7a;
                      goto LAB_003bbe69;
                    }
                    bVar7 = true;
                  }
                  else {
                    if ((pSVar12->kind == Subroutine) &&
                       ((((ulong)pSVar12[2].originatingSyntax & 0x100000000) != 0 ||
                        (*(long *)(pSVar12 + 4) != 0)))) {
                      iVar15.current[3].parentScope = (Scope *)pSVar12;
                    }
LAB_003bbd7a:
                    bVar7 = false;
                    pCVar18 = pCVar17;
                  }
                  pCVar17 = pCVar18;
                } while (bVar7);
              }
              pSVar13 = (SubroutineSymbol *)iVar15.current[3].parentScope;
              if ((pSVar13 != (SubroutineSymbol *)0x0) &&
                 (derivedMethod =
                       MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)iVar15.current)
                 , derivedMethod != (SubroutineSymbol *)0x0)) {
                pSVar4 = (context->scope).ptr;
                if (pSVar4 == (Scope *)0x0) goto LAB_003bbe9f;
                if ((pSVar13->super_Symbol).kind != Subroutine) {
                  pcVar14 = 
                  "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::SubroutineSymbol]";
                  goto LAB_003bbe95;
                }
                SubroutineSymbol::checkVirtualMethodMatch(pSVar4,pSVar13,derivedMethod,true);
              }
            }
            else {
              pCVar17 = pCVar8;
              if (SVar3 == ConstraintBlock) {
                do {
                  pSVar12 = Scope::find(&pCVar17->super_Scope,(iVar15.current)->name);
                  if (pSVar12 == (Symbol *)0x0) {
                    if ((pCVar17->super_Scope).deferredMemberIndex != Invalid) {
                      Scope::elaborate(&pCVar17->super_Scope);
                    }
                    pTVar6 = pCVar17->baseClass;
                    if (pTVar6 == (Type *)0x0) goto LAB_003bbc62;
                    if (pTVar6->canonical == (Type *)0x0) {
                      Type::resolveCanonical(pTVar6);
                    }
                    if ((pTVar6->canonical->super_Symbol).kind == ErrorType) goto LAB_003bbc62;
                    pCVar17 = (ClassType *)pTVar6->canonical;
                    bVar7 = true;
                    if ((pCVar17->super_Type).super_Symbol.kind != ClassType) goto LAB_003bbe69;
                  }
                  else {
                    if ((pSVar12->kind == ConstraintBlock) &&
                       (*(char *)((long)&pSVar12[1].originatingSyntax + 3) == '\x01')) {
                      if (((Symbol *)&(iVar15.current)->kind)->kind != ConstraintBlock) {
                        pcVar14 = 
                        "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ConstraintBlockSymbol]"
                        ;
                        goto LAB_003bbe95;
                      }
                      if (*(char *)&pSVar12[1].originatingSyntax !=
                          *(char *)&iVar15.current[1].originatingSyntax) {
                        pDVar9 = ASTContext::addDiag(context,(DiagCode)0x5c0006,
                                                     (iVar15.current)->location);
                        Diagnostic::addNote(pDVar9,(DiagCode)0x40001,pSVar12->location);
                      }
                    }
LAB_003bbc62:
                    bVar7 = false;
                  }
                } while (bVar7);
              }
            }
            Scope::iterator::operator++(&local_58);
          } while ((SubroutineSymbol *)local_58.current != (SubroutineSymbol *)0x0);
        }
      }
      return;
    }
    pcVar14 = 
    "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]";
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,pcVar14);
LAB_003bbe69:
  pcVar14 = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassType]";
LAB_003bbe95:
  assert::assertFailed
            ("T::isKind(kind)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
             ,0xc4,pcVar14);
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags & MethodFlags::Pure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.isPure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase || possibleBase->isError())
                break;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine)
            checkForOverride(member.as<SubroutineSymbol>());
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            auto currentBase = baseType;
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.isPure &&
                            baseConstraint.isStatic !=
                                member.as<ConstraintBlockSymbol>().isStatic) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }
        }
    }
}